

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::
     print_container<std::vector<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>,std::allocator<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>>>,pstack::Dwarf::CFI_const*const&>
               (ostream *os,
               vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
               *container,CFI **ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_const_pstack::Dwarf::CFI_*>
  local_60;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *local_50;
  unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *field;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
  *__range2;
  char *sep;
  CFI **ctx_local;
  vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
  *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
              *)0x2a9a45;
  __end0 = std::
           vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
           ::begin(container);
  field = (unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_> *)
          std::
          vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
          ::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_*,_std::vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>_>
                      (&__end0,(__normal_iterator<const_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_*,_std::vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>_>
                                *)&field);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_*,_std::vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>_>
               ::operator*(&__end0);
    os_00 = std::operator<<(os,(char *)__range2);
    local_60 = json<std::unique_ptr<pstack::Dwarf::FDE,std::default_delete<pstack::Dwarf::FDE>>,pstack::Dwarf::CFI_const*>
                         (local_50,ctx);
    operator<<(os_00,&local_60);
    __range2 = (vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>
                *)anon_var_dwarf_c456f;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_*,_std::vector<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>,_std::allocator<std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>_>_>
    ::operator++(&__end0);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}